

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hop.h
# Opt level: O2

Hop_Obj_t * Hop_ManFetchMemory(Hop_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Hop_Obj_t *Entry;
  
  Entry = p->pListFree;
  if (Entry == (Hop_Obj_t *)0x0) {
    Hop_ManAddMemory(p);
    Entry = p->pListFree;
  }
  p->pListFree = (Hop_Obj_t *)Entry->field_0;
  *(undefined8 *)&Entry->field_0x20 = 0;
  Entry->pFanin0 = (Hop_Obj_t *)0x0;
  Entry->pFanin1 = (Hop_Obj_t *)0x0;
  (Entry->field_0).pData = (void *)0x0;
  (Entry->field_1).pNext = (Hop_Obj_t *)0x0;
  p_00 = p->vObjs;
  if (p_00 != (Vec_Ptr_t *)0x0) {
    if (p->nCreated != p_00->nSize) {
      __assert_fail("p->nCreated == Vec_PtrSize(p->vObjs)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                    ,0xf0,"Hop_Obj_t *Hop_ManFetchMemory(Hop_Man_t *)");
    }
    Vec_PtrPush(p_00,Entry);
  }
  iVar1 = p->nCreated;
  p->nCreated = iVar1 + 1;
  Entry->Id = iVar1;
  return Entry;
}

Assistant:

static inline Hop_Obj_t * Hop_ManFetchMemory( Hop_Man_t * p )  
{ 
    Hop_Obj_t * pTemp;
    if ( p->pListFree == NULL )
        Hop_ManAddMemory( p );
    pTemp = p->pListFree;
    p->pListFree = *((Hop_Obj_t **)pTemp);
    memset( pTemp, 0, sizeof(Hop_Obj_t) ); 
    if ( p->vObjs )
    {
        assert( p->nCreated == Vec_PtrSize(p->vObjs) );
        Vec_PtrPush( p->vObjs, pTemp );
    }
    pTemp->Id = p->nCreated++;
    return pTemp;
}